

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O3

bool children(log_multi *b,uint32_t *current,uint32_t *class_index,uint32_t label)

{
  v_array<node> *this;
  uint32_t *puVar1;
  size_t sVar2;
  ostream *poVar3;
  ulong uVar4;
  uint uVar5;
  node *pnVar6;
  node *pnVar7;
  uint uVar8;
  ulong uVar9;
  uint32_t uVar10;
  ulong uVar11;
  ulong uVar12;
  node node;
  node local_88;
  
  this = &b->nodes;
  local_88.preds._end = (node_pred *)(ulong)label;
  local_88._0_8_ = 0;
  local_88.preds._begin = (node_pred *)0x0;
  sVar2 = v_array<node_pred>::unique_add_sorted
                    (&(b->nodes)._begin[*current].preds,(node_pred *)&local_88);
  *class_index = (uint32_t)sVar2;
  puVar1 = &(b->nodes)._begin[*current].preds._begin[sVar2 & 0xffffffff].label_count;
  *puVar1 = *puVar1 + 1;
  uVar9 = (ulong)*current;
  pnVar6 = (b->nodes)._begin;
  uVar8 = pnVar6[uVar9].preds._begin[*class_index].label_count;
  if (pnVar6[uVar9].max_count < uVar8) {
    pnVar6[uVar9].max_count = uVar8;
    this->_begin[*current].max_count_label = this->_begin[*current].preds._begin[*class_index].label
    ;
    uVar9 = (ulong)*current;
    pnVar6 = this->_begin;
  }
  if (pnVar6[uVar9].internal != false) {
    return true;
  }
  if (1 < (ulong)(((long)pnVar6[uVar9].preds._end - (long)pnVar6[uVar9].preds._begin >> 3) *
                 -0x5555555555555555)) {
    if (b->predictors_used < b->max_predictors) {
      uVar12 = ((long)(b->nodes)._end - (long)pnVar6 >> 3) * 0x2e8ba2e8ba2e8ba3;
      local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
      local_88.preds._begin = (node_pred *)0x0;
      local_88.preds._end = (node_pred *)0x0;
      local_88.preds.end_array = (node_pred *)0x0;
      local_88.preds.erase_count._0_5_ = 0;
      local_88.preds.erase_count._5_3_ = 0;
      local_88.min_count = 0;
      local_88.internal = false;
      v_array<node_pred>::clear(&local_88.preds);
      local_88.base_predictor = 0;
      local_88.left = 0;
      local_88._60_8_ = 0;
      local_88._68_8_ = 0;
      local_88.max_count = 0;
      local_88.max_count_label = 1;
      local_88.right = 0;
      v_array<node>::push_back(this,&local_88);
      uVar9 = ((long)(b->nodes)._end - (long)(b->nodes)._begin >> 3) * 0x2e8ba2e8ba2e8ba3;
      local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
      local_88.preds._begin = (node_pred *)0x0;
      local_88.preds._end = (node_pred *)0x0;
      local_88.preds.end_array = (node_pred *)0x0;
      local_88.preds.erase_count._0_5_ = 0;
      local_88.preds.erase_count._5_3_ = 0;
      local_88.min_count = 0;
      local_88.internal = false;
      v_array<node_pred>::clear(&local_88.preds);
      local_88.base_predictor = 0;
      local_88.left = 0;
      local_88._60_8_ = 0;
      local_88._68_8_ = 0;
      local_88.max_count = 0;
      local_88.max_count_label = 1;
      local_88.right = 0;
      v_array<node>::push_back(this,&local_88);
      pnVar6 = (b->nodes)._begin;
      sVar2 = b->predictors_used;
      b->predictors_used = sVar2 + 1;
      pnVar6[*current].base_predictor = (uint32_t)sVar2;
      uVar11 = uVar12 & 0xffffffff;
      uVar8 = (uint)uVar9;
      uVar9 = uVar9 & 0xffffffff;
    }
    else {
      if (pnVar6[uVar9].min_count - pnVar6[uVar9].max_count <=
          (pnVar6->min_count + 1) * b->swap_resist) goto LAB_001f4e3d;
      pnVar7 = pnVar6;
      if (pnVar6->internal == true) {
        do {
          uVar11 = (ulong)pnVar7->right;
          if (pnVar6[pnVar7->left].min_count < pnVar6[uVar11].min_count) {
            uVar11 = (ulong)pnVar7->left;
          }
          pnVar7 = pnVar6 + uVar11;
        } while (pnVar6[uVar11].internal != false);
        uVar8 = pnVar6[uVar11].parent;
        uVar9 = (ulong)uVar8;
        uVar10 = pnVar6[uVar9].parent;
        if (pnVar6[uVar11].min_count != pnVar6->min_count) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"glargh ",7);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," != ",4);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          pnVar6 = this->_begin;
        }
      }
      else {
        uVar8 = pnVar6->parent;
        uVar9 = (ulong)uVar8;
        uVar10 = pnVar6[uVar9].parent;
        uVar11 = 0;
      }
      b->nbofswaps = b->nbofswaps + 1;
      uVar5 = pnVar6[uVar9].right;
      if ((uint)uVar11 == uVar5) {
        uVar5 = pnVar6[uVar9].left;
      }
      if (uVar8 == pnVar6[uVar10].left) {
        pnVar6[uVar10].left = uVar5;
      }
      else {
        pnVar6[uVar10].right = uVar5;
      }
      this->_begin[uVar5].parent = uVar10;
      uVar12 = (ulong)uVar5;
      while ((int)uVar12 != 0) {
        pnVar6 = this->_begin;
        uVar4 = (ulong)pnVar6[uVar12].parent;
        if (pnVar6[uVar4].min_count == pnVar6[uVar12].min_count) break;
        uVar5 = pnVar6[pnVar6[uVar4].left].min_count;
        if (pnVar6[pnVar6[uVar4].right].min_count < pnVar6[pnVar6[uVar4].left].min_count) {
          uVar5 = pnVar6[pnVar6[uVar4].right].min_count;
        }
        pnVar6[uVar4].min_count = uVar5;
        uVar12 = uVar4;
      }
      pnVar6 = this->_begin;
      pnVar6[uVar11].internal = false;
      v_array<node_pred>::clear(&pnVar6[uVar11].preds);
      pnVar6[uVar11].base_predictor = 0;
      pnVar6[uVar11].left = 0;
      *(undefined8 *)&pnVar6[uVar11].norm_Eh = 0;
      *(undefined8 *)((long)&pnVar6[uVar11].Eh + 4) = 0;
      pnVar6[uVar11].max_count = 0;
      pnVar6[uVar11].max_count_label = 1;
      pnVar6[uVar11].right = 0;
      this->_begin[*current].base_predictor = this->_begin[uVar9].base_predictor;
      pnVar6 = this->_begin;
      pnVar6[uVar9].internal = false;
      v_array<node_pred>::clear(&pnVar6[uVar9].preds);
      pnVar6[uVar9].base_predictor = 0;
      pnVar6[uVar9].left = 0;
      *(undefined8 *)&pnVar6[uVar9].norm_Eh = 0;
      *(undefined8 *)((long)&pnVar6[uVar9].Eh + 4) = 0;
      pnVar6[uVar9].max_count = 0;
      pnVar6[uVar9].max_count_label = 1;
      pnVar6[uVar9].right = 0;
      uVar12 = uVar11;
    }
    this->_begin[*current].left = (uint32_t)uVar12;
    uVar5 = *current;
    this->_begin[uVar11].parent = uVar5;
    this->_begin[uVar5].right = uVar8;
    uVar8 = *current;
    this->_begin[uVar9].parent = uVar8;
    this->_begin[uVar11].min_count = this->_begin[uVar8].min_count >> 1;
    pnVar6 = this->_begin;
    pnVar6[uVar9].min_count = pnVar6[*current].min_count - pnVar6[uVar11].min_count;
    while ((int)uVar12 != 0) {
      uVar4 = uVar12 & 0xffffffff;
      pnVar6 = this->_begin;
      uVar12 = (ulong)pnVar6[uVar4].parent;
      if (pnVar6[uVar12].min_count == pnVar6[uVar4].min_count) break;
      uVar8 = pnVar6[pnVar6[uVar12].left].min_count;
      if (pnVar6[pnVar6[uVar12].right].min_count < pnVar6[pnVar6[uVar12].left].min_count) {
        uVar8 = pnVar6[pnVar6[uVar12].right].min_count;
      }
      pnVar6[uVar12].min_count = uVar8;
    }
    this->_begin[uVar11].max_count_label = this->_begin[*current].max_count_label;
    this->_begin[uVar9].max_count_label = this->_begin[*current].max_count_label;
    this->_begin[*current].internal = true;
    uVar9 = (ulong)*current;
    pnVar6 = this->_begin;
  }
LAB_001f4e3d:
  return pnVar6[uVar9].internal;
}

Assistant:

bool children(log_multi& b, uint32_t& current, uint32_t& class_index, uint32_t label)
{
  class_index = (uint32_t)b.nodes[current].preds.unique_add_sorted(node_pred(label));
  b.nodes[current].preds[class_index].label_count++;

  if (b.nodes[current].preds[class_index].label_count > b.nodes[current].max_count)
  {
    b.nodes[current].max_count = b.nodes[current].preds[class_index].label_count;
    b.nodes[current].max_count_label = b.nodes[current].preds[class_index].label;
  }

  if (b.nodes[current].internal)
    return true;
  else if (b.nodes[current].preds.size() > 1 &&
      (b.predictors_used < b.max_predictors ||
          b.nodes[current].min_count - b.nodes[current].max_count > b.swap_resist * (b.nodes[0].min_count + 1)))
  {
    // need children and we can make them.
    uint32_t left_child;
    uint32_t right_child;
    if (b.predictors_used < b.max_predictors)
    {
      left_child = (uint32_t)b.nodes.size();
      b.nodes.push_back(init_node());
      right_child = (uint32_t)b.nodes.size();
      b.nodes.push_back(init_node());
      b.nodes[current].base_predictor = (uint32_t)b.predictors_used++;
    }
    else
    {
      uint32_t swap_child = find_switch_node(b);
      uint32_t swap_parent = b.nodes[swap_child].parent;
      uint32_t swap_grandparent = b.nodes[swap_parent].parent;
      if (b.nodes[swap_child].min_count != b.nodes[0].min_count)
        cout << "glargh " << b.nodes[swap_child].min_count << " != " << b.nodes[0].min_count << endl;
      b.nbofswaps++;

      uint32_t nonswap_child;
      if (swap_child == b.nodes[swap_parent].right)
        nonswap_child = b.nodes[swap_parent].left;
      else
        nonswap_child = b.nodes[swap_parent].right;

      if (swap_parent == b.nodes[swap_grandparent].left)
        b.nodes[swap_grandparent].left = nonswap_child;
      else
        b.nodes[swap_grandparent].right = nonswap_child;
      b.nodes[nonswap_child].parent = swap_grandparent;
      update_min_count(b, nonswap_child);

      init_leaf(b.nodes[swap_child]);
      left_child = swap_child;
      b.nodes[current].base_predictor = b.nodes[swap_parent].base_predictor;
      init_leaf(b.nodes[swap_parent]);
      right_child = swap_parent;
    }
    b.nodes[current].left = left_child;
    b.nodes[left_child].parent = current;
    b.nodes[current].right = right_child;
    b.nodes[right_child].parent = current;

    b.nodes[left_child].min_count = b.nodes[current].min_count / 2;
    b.nodes[right_child].min_count = b.nodes[current].min_count - b.nodes[left_child].min_count;
    update_min_count(b, left_child);

    b.nodes[left_child].max_count_label = b.nodes[current].max_count_label;
    b.nodes[right_child].max_count_label = b.nodes[current].max_count_label;

    b.nodes[current].internal = true;
  }
  return b.nodes[current].internal;
}